

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3CodeRowTriggerDirect
               (Parse *pParse,Trigger *p,Table *pTab,int reg,int orconf,int ignoreJump)

{
  Vdbe *p_00;
  TriggerPrg *pTVar1;
  undefined4 in_ECX;
  Trigger *in_RDX;
  Parse *in_RSI;
  long *in_RDI;
  undefined4 in_R8D;
  int in_R9D;
  u8 val;
  int bRecursive;
  TriggerPrg *pPrg;
  Vdbe *v;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd8;
  
  p_00 = sqlite3GetVdbe((Parse *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  pTVar1 = getRowTrigger(in_RSI,in_RDX,(Table *)CONCAT44(in_ECX,in_R8D),in_R9D);
  if (pTVar1 != (TriggerPrg *)0x0) {
    val = false;
    if (in_RSI->db != (sqlite3 *)0x0) {
      val = (*(uint *)(*in_RDI + 0x2c) & 0x40000) == 0;
    }
    *(int *)((long)in_RDI + 0x54) = *(int *)((long)in_RDI + 0x54) + 1;
    sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_R9D,in_stack_ffffffffffffffd8),(int)((ulong)p_00 >> 0x20),
                      (int)p_00,(int)((ulong)pTVar1 >> 0x20),(int)pTVar1);
    sqlite3VdbeChangeP4((Vdbe *)CONCAT44(in_ECX,in_R8D),in_R9D,(char *)p_00,
                        (int)((ulong)pTVar1 >> 0x20));
    sqlite3VdbeChangeP5(p_00,val);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeRowTriggerDirect(
  Parse *pParse,       /* Parse context */
  Trigger *p,          /* Trigger to code */
  Table *pTab,         /* The table to code triggers from */
  int reg,             /* Reg array containing OLD.* and NEW.* values */
  int orconf,          /* ON CONFLICT policy */
  int ignoreJump       /* Instruction to jump to for RAISE(IGNORE) */
){
  Vdbe *v = sqlite3GetVdbe(pParse); /* Main VM */
  TriggerPrg *pPrg;
  pPrg = getRowTrigger(pParse, p, pTab, orconf);
  assert( pPrg || pParse->nErr || pParse->db->mallocFailed );

  /* Code the OP_Program opcode in the parent VDBE. P4 of the OP_Program 
  ** is a pointer to the sub-vdbe containing the trigger program.  */
  if( pPrg ){
    int bRecursive = (p->zName && 0==(pParse->db->flags&SQLITE_RecTriggers));

    sqlite3VdbeAddOp3(v, OP_Program, reg, ignoreJump, ++pParse->nMem);
    sqlite3VdbeChangeP4(v, -1, (const char *)pPrg->pProgram, P4_SUBPROGRAM);
    VdbeComment(
        (v, "Call: %s.%s", (p->zName?p->zName:"fkey"), onErrorText(orconf)));

    /* Set the P5 operand of the OP_Program instruction to non-zero if
    ** recursive invocation of this trigger program is disallowed. Recursive
    ** invocation is disallowed if (a) the sub-program is really a trigger,
    ** not a foreign key action, and (b) the flag to enable recursive triggers
    ** is clear.  */
    sqlite3VdbeChangeP5(v, (u8)bRecursive);
  }
}